

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O1

ValueInfo * __thiscall
ValueInfo::CopyWithGenericStructureKind(ValueInfo *this,JitArenaAllocator *allocator)

{
  ValueInfo *this_00;
  
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,allocator,0x3f1274);
  (this_00->super_ValueType).field_0 = (this->super_ValueType).field_0;
  this_00->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014ea2e8;
  this_00->structureKind = Generic;
  this_00->symStore = (Sym *)0x0;
  SetSymStore(this_00,this->symStore);
  return this_00;
}

Assistant:

ValueInfo *             CopyWithGenericStructureKind(JitArenaAllocator * allocator) const
    {
        return JitAnew(allocator, ValueInfo, *this, false);
    }